

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZManVector<TFad<6,_double>,_3>_>::Resize
          (TPZVec<TPZManVector<TFad<6,_double>,_3>_> *this,int64_t newsize,
          TPZManVector<TFad<6,_double>,_3> *object)

{
  double dVar1;
  undefined1 auVar2 [16];
  int64_t *piVar3;
  ostream *poVar4;
  TPZManVector<TFad<6,_double>,_3> *pTVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  TPZManVector<TFad<6,_double>,_3> *pTVar10;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    return;
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      pTVar10 = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0xe0),8) == 0) {
        uVar7 = SUB168(auVar2 * ZEXT816(0xe0),0) | 8;
      }
      piVar3 = (int64_t *)operator_new__(uVar7);
      *piVar3 = newsize;
      pTVar10 = (TPZManVector<TFad<6,_double>,_3> *)(piVar3 + 1);
      lVar8 = 0;
      pTVar5 = pTVar10;
      do {
        TPZManVector<TFad<6,_double>,_3>::TPZManVector(pTVar5,0);
        lVar8 = lVar8 + -0xe0;
        pTVar5 = pTVar5 + 1;
      } while (newsize * -0xe0 - lVar8 != 0);
      lVar8 = this->fNElements;
    }
    if (newsize <= lVar8) {
      lVar8 = newsize;
    }
    lVar9 = 0;
    lVar6 = lVar8;
    if (lVar8 < 1) {
      lVar8 = lVar9;
      lVar6 = lVar9;
    }
    while (lVar8 != 0) {
      TPZManVector<TFad<6,_double>,_3>::operator=
                ((TPZManVector<TFad<6,_double>,_3> *)
                 ((long)pTVar10->fExtAlloc[0].dx_ + lVar9 + -0x30),
                 (TPZManVector<TFad<6,_double>,_3> *)
                 ((long)this->fStore->fExtAlloc[0].dx_ + lVar9 + -0x30));
      lVar9 = lVar9 + 0xe0;
      lVar8 = lVar8 + -1;
    }
    pTVar5 = pTVar10 + lVar6;
    for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
      TPZManVector<TFad<6,_double>,_3>::operator=(pTVar5,object);
      pTVar5 = pTVar5 + 1;
    }
    pTVar5 = this->fStore;
    if (pTVar5 != (TPZManVector<TFad<6,_double>,_3> *)0x0) {
      dVar1 = pTVar5[-1].fExtAlloc[2].dx_[5];
      if (dVar1 != 0.0) {
        lVar8 = (long)dVar1 * 0xe0;
        do {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_3> *)
                     ((long)pTVar5[-1].fExtAlloc[0].dx_ + lVar8 + -0x30));
          lVar8 = lVar8 + -0xe0;
        } while (lVar8 != 0);
      }
      operator_delete__(pTVar5[-1].fExtAlloc[2].dx_ + 5,(long)dVar1 * 0xe0 | 8);
      this->fStore = (TPZManVector<TFad<6,_double>,_3> *)0x0;
    }
    this->fStore = pTVar10;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}